

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istring.h
# Opt level: O3

bool __thiscall wasm::IString::operator<(IString *this,IString *other)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  difference_type __diff;
  ulong uVar4;
  
  uVar1 = (this->str)._M_len;
  uVar2 = (other->str)._M_len;
  uVar4 = uVar2;
  if (uVar1 < uVar2) {
    uVar4 = uVar1;
  }
  if (uVar4 != 0) {
    uVar3 = memcmp((this->str)._M_str,(other->str)._M_str,uVar4);
    uVar4 = (ulong)uVar3;
    if (uVar3 != 0) goto LAB_0013b418;
  }
  uVar4 = 0xffffffff80000000;
  if (-0x80000000 < (long)(uVar1 - uVar2)) {
    uVar4 = uVar1 - uVar2;
  }
  if (0x7ffffffe < (long)uVar4) {
    uVar4 = 0;
  }
LAB_0013b418:
  return (bool)((byte)(uVar4 >> 0x1f) & 1);
}

Assistant:

bool operator<(const IString& other) const { return str < other.str; }